

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

void __thiscall QToolBarAreaLayoutLine::fitLayout(QToolBarAreaLayoutLine *this)

{
  QToolBarAreaLayoutItem *this_00;
  Orientation OVar1;
  long *plVar2;
  char cVar3;
  int iVar4;
  QSize QVar5;
  pointer pQVar6;
  undefined4 extraout_var;
  QToolBarLayout *this_01;
  QSize QVar7;
  Representation RVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  int local_44;
  
  OVar1 = this->o;
  QVar5 = minimumSize(this);
  if ((this->toolBarItems).d.size == 0) {
    uVar12 = 0xffffffff;
  }
  else {
    iVar4 = (this->rect).y2.m_i - (this->rect).y1.m_i;
    if (this->o == Horizontal) {
      iVar4 = (this->rect).x2.m_i - (this->rect).x1.m_i;
    }
    RVar8 = QVar5.ht.m_i;
    if (OVar1 == Horizontal) {
      RVar8 = QVar5.wd.m_i;
    }
    local_44 = (iVar4 - RVar8.m_i) + 1;
    lVar13 = 0;
    if (local_44 < 1) {
      local_44 = 0;
    }
    uVar11 = 0xffffffff;
    uVar12 = 0;
    do {
      pQVar6 = QList<QToolBarAreaLayoutItem>::data(&this->toolBarItems);
      this_00 = (QToolBarAreaLayoutItem *)((long)&pQVar6->widgetItem + lVar13);
      if ((&pQVar6->gap)[lVar13] == false) {
        if (this_00->widgetItem != (QLayoutItem *)0x0) {
          iVar4 = (*this_00->widgetItem->_vptr_QLayoutItem[8])();
          if ((char)iVar4 == '\0') goto LAB_004b73f6;
        }
      }
      else {
LAB_004b73f6:
        iVar4 = (*this_00->widgetItem->_vptr_QLayoutItem[0xd])();
        QWidget::layout((QWidget *)CONCAT44(extraout_var,iVar4));
        this_01 = (QToolBarLayout *)QMetaObject::cast((QObject *)&QToolBarLayout::staticMetaObject);
        if (this_01 != (QToolBarLayout *)0x0) {
          QToolBarLayout::checkUsePopupMenu(this_01);
        }
        OVar1 = this->o;
        QVar7 = QToolBarAreaLayoutItem::minimumSize(this_00);
        QVar5 = (QSize)((ulong)QVar7 >> 0x20);
        if (OVar1 == Horizontal) {
          QVar5 = QVar7;
        }
        RVar8.m_i = *(int *)((long)&pQVar6->preferredSize + lVar13);
        if (RVar8.m_i < 1) {
          OVar1 = this->o;
          QVar7 = QToolBarAreaLayoutItem::sizeHint(this_00);
          RVar8.m_i = QVar7.ht.m_i.m_i;
          if (OVar1 == Horizontal) {
            RVar8.m_i = QVar7.wd.m_i.m_i;
          }
        }
        iVar4 = RVar8.m_i - QVar5.wd.m_i;
        if (local_44 <= iVar4) {
          iVar4 = local_44;
        }
        *(int *)((long)&pQVar6->size + lVar13) = QVar5.wd.m_i.m_i + iVar4;
        local_44 = local_44 - iVar4;
        uVar11 = (uint)uVar12;
      }
      uVar12 = uVar12 + 1;
      lVar13 = lVar13 + 0x18;
    } while (uVar12 < (ulong)(this->toolBarItems).d.size);
    uVar12 = (ulong)uVar11;
  }
  if ((this->toolBarItems).d.size != 0) {
    lVar13 = 0x14;
    uVar10 = 0;
    iVar4 = 0;
    do {
      pQVar6 = QList<QToolBarAreaLayoutItem>::data(&this->toolBarItems);
      if (*(char *)((long)&pQVar6->widgetItem + lVar13) == '\0') {
        plVar2 = *(long **)((long)pQVar6 + lVar13 + -0x14);
        if (plVar2 != (long *)0x0) {
          cVar3 = (**(code **)(*plVar2 + 0x40))();
          if (cVar3 == '\0') goto LAB_004b74d8;
        }
      }
      else {
LAB_004b74d8:
        *(int *)((long)pQVar6 + lVar13 + -0xc) = iVar4;
        if (uVar12 == uVar10) {
          iVar9 = (this->rect).y2.m_i - (this->rect).y1.m_i;
          if (this->o == Horizontal) {
            iVar9 = (this->rect).x2.m_i - (this->rect).x1.m_i;
          }
          iVar9 = (iVar9 - iVar4) + 1;
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          *(int *)((long)pQVar6 + lVar13 + -8) = iVar9;
        }
        iVar4 = iVar4 + *(int *)((long)pQVar6 + lVar13 + -8);
      }
      uVar10 = uVar10 + 1;
      lVar13 = lVar13 + 0x18;
    } while (uVar10 < (ulong)(this->toolBarItems).d.size);
  }
  return;
}

Assistant:

void QToolBarAreaLayoutLine::fitLayout()
{
    int last = -1;
    int min = pick(o, minimumSize());
    int space = pick(o, rect.size());
    int extra = qMax(0, space - min);

    for (int i = 0; i < toolBarItems.size(); ++i) {
        QToolBarAreaLayoutItem &item = toolBarItems[i];
        if (item.skip())
            continue;

        if (QToolBarLayout *tblayout = qobject_cast<QToolBarLayout*>(item.widgetItem->widget()->layout()))
            tblayout->checkUsePopupMenu();

        const int itemMin = pick(o, item.minimumSize());
        //preferredSize is the default if it is set, otherwise, we take the sizehint
        item.size = item.preferredSize > 0 ? item.preferredSize : pick(o, item.sizeHint());

        //the extraspace is the space above the item minimum sizehint
        const int extraSpace = qMin(item.size - itemMin, extra);
        item.size = itemMin + extraSpace; //that is the real size

        extra -= extraSpace;

        last = i;
    }

    // calculate the positions from the sizes
    int pos = 0;
    for (int i = 0; i < toolBarItems.size(); ++i) {
        QToolBarAreaLayoutItem &item = toolBarItems[i];
        if (item.skip())
            continue;

        item.pos = pos;
        if (i == last) // stretch the last item to the end of the line
            item.size = qMax(0, pick(o, rect.size()) - item.pos);
        pos += item.size;
    }
}